

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O3

void __thiscall
Am_Drawonable_Impl::adjust_gcvalues_color_xor
          (Am_Drawonable_Impl *this,XGCValues *values,unsigned_long *mask,unsigned_long fore_index)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  
  uVar1 = this->screen->whitepixel;
  uVar3 = fore_index;
  if (((uVar1 != 0) && (uVar2 = this->screen->blackpixel, uVar3 = uVar1, uVar2 != fore_index)) &&
     (uVar3 = fore_index, uVar1 == fore_index)) {
    uVar3 = uVar2;
  }
  if (values->foreground != uVar3) {
    values->foreground = uVar3;
    *(byte *)mask = (byte)*mask | 4;
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::adjust_gcvalues_color_xor(XGCValues &values,
                                              unsigned long &mask,
                                              unsigned long fore_index) const
{
  // Compensate for white == 1 on an HP-type display
  if (screen->whitepixel) {
    if (fore_index == screen->blackpixel)
      fore_index = screen->whitepixel;
    else if (fore_index == screen->whitepixel)
      fore_index = screen->blackpixel;
  }

  adjust_gcvalues_color(values, mask, fore_index);
}